

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  *(undefined8 *)&this[-1].field_0x80 = 0x8b7728;
  *(undefined8 *)&this->field_0x68 = 0x8b7840;
  *(undefined8 *)&this[-1].field_0x108 = 0x8b7750;
  *(undefined8 *)&this[-1].field_0x118 = 0x8b7778;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x8b77a0;
  this[-1].ConstructionType.ptr._M_string_length = 0x8b77c8;
  *(undefined8 *)this = 0x8b77f0;
  *(undefined8 *)&this->field_0x10 = 0x8b7818;
  if (*(undefined1 **)&this->field_0x40 != &this->field_0x50) {
    operator_delete(*(undefined1 **)&this->field_0x40);
  }
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x80,&PTR_construction_vtable_24__008b7860);
  operator_delete(&this[-1].field_0x80);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}